

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedObjectFile.cpp
# Opt level: O3

shared_ptr<Form> __thiscall
LinkedObjectFile::to_form_script_object
          (LinkedObjectFile *this,int seg,int byte_idx,vector<bool,_std::allocator<bool>_> *seen)

{
  LinkedWord *word;
  pointer pvVar1;
  long lVar2;
  pointer pLVar3;
  element_type *peVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  char cVar6;
  char cVar7;
  bool bVar8;
  uint uVar9;
  ulong uVar10;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  uint uVar12;
  undefined4 in_register_00000034;
  LinkedObjectFile *this_00;
  ulong uVar13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var14;
  shared_ptr<Form> sVar15;
  string debug;
  undefined1 local_68 [32];
  _Alloc_hider local_48;
  size_type sStack_40;
  
  this_00 = (LinkedObjectFile *)CONCAT44(in_register_00000034,seg);
  (this->stats).total_code_bytes = 0;
  (this->stats).total_v2_code_bytes = 0;
  (this->stats).total_v2_pointers = 0;
  _Var5 = gSymbolTable.empty_pair.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  peVar4 = gSymbolTable.empty_pair.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (this->stats).total_v2_pointer_seeks = 0;
  uVar9 = (uint)seen;
  if (((ulong)seen & 3) != 0) {
    printf("align %d\n",(ulong)(uVar9 & 7));
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFile.cpp"
                  ,0x328,
                  "std::shared_ptr<Form> LinkedObjectFile::to_form_script_object(int, int, std::vector<bool> &)"
                 );
  }
  uVar13 = (ulong)byte_idx;
  pvVar1 = (this_00->words_by_seg).
           super__Vector_base<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar10 = ((long)(this_00->words_by_seg).
                  super__Vector_base<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 3) *
           -0x5555555555555555;
  if (uVar10 < uVar13 || uVar10 - uVar13 == 0) {
LAB_0013091e:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
  }
  uVar12 = uVar9 + 3;
  if (-1 < (int)uVar9) {
    uVar12 = uVar9;
  }
  p_Var14 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(long)((int)uVar12 >> 2);
  lVar2 = *(long *)&pvVar1[uVar13].super__Vector_base<LinkedWord,_std::allocator<LinkedWord>_>.
                    _M_impl.super__Vector_impl_data;
  _Var11._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 (((long)*(pointer *)
                          ((long)&pvVar1[uVar13].
                                  super__Vector_base<LinkedWord,_std::allocator<LinkedWord>_>.
                                  _M_impl.super__Vector_impl_data + 8) - lVar2 >> 4) *
                 -0x5555555555555555);
  if (_Var11._M_pi < p_Var14 || (long)_Var11._M_pi - (long)p_Var14 == 0) goto LAB_0013091e;
  word = (LinkedWord *)(lVar2 + (long)p_Var14 * 0x30);
  switch(*(undefined4 *)(lVar2 + (long)p_Var14 * 0x30)) {
  case 0:
    uVar9 = word->data;
    cVar7 = '\x01';
    if (9 < uVar9) {
      uVar12 = uVar9;
      cVar6 = '\x04';
      do {
        cVar7 = cVar6;
        if (uVar12 < 100) {
          cVar7 = cVar7 + -2;
          goto LAB_001308b3;
        }
        if (uVar12 < 1000) {
          cVar7 = cVar7 + -1;
          goto LAB_001308b3;
        }
        if (uVar12 < 10000) goto LAB_001308b3;
        bVar8 = 99999 < uVar12;
        uVar12 = uVar12 / 10000;
        cVar6 = cVar7 + '\x04';
      } while (bVar8);
      cVar7 = cVar7 + '\x01';
    }
LAB_001308b3:
    local_68._0_8_ = local_68 + 0x10;
    std::__cxx11::string::_M_construct((ulong)local_68,cVar7);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_68._0_8_,local_68._8_4_,uVar9);
    sVar15 = toForm((string *)&local_48);
    _Var11 = sVar15.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    *(pointer *)&this->stats = local_48._M_p;
    (this->stats).total_v2_pointers = (undefined4)sStack_40;
    (this->stats).total_v2_pointer_seeks = sStack_40._4_4_;
    if ((undefined1 *)local_68._0_8_ == local_68 + 0x10) goto LAB_0013090c;
    break;
  case 1:
    uVar13 = (ulong)word->label_id;
    pLVar3 = (this_00->labels).super__Vector_base<Label,_std::allocator<Label>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar10 = ((long)(this_00->labels).super__Vector_base<Label,_std::allocator<Label>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pLVar3 >> 3) * -0x3333333333333333;
    if (uVar10 < uVar13 || uVar10 - uVar13 == 0) goto LAB_0013091e;
    uVar9 = pLVar3[uVar13].offset;
    if ((uVar9 & 7) == 2) {
      uVar12 = uVar9 + 3;
      if (-1 < (int)uVar9) {
        uVar12 = uVar9;
      }
      sVar15 = to_form_script((LinkedObjectFile *)local_68,seg,byte_idx,
                              (vector<bool,_std::allocator<bool>_> *)(ulong)(uint)((int)uVar12 >> 2)
                             );
      _Var11 = sVar15.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      goto LAB_001307ed;
    }
    bVar8 = is_string(this_00,byte_idx,uVar9);
    if (!bVar8) {
      uVar10 = ((long)(this_00->labels).super__Vector_base<Label,_std::allocator<Label>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this_00->labels).super__Vector_base<Label,_std::allocator<Label>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
      if (uVar10 < (ulong)(long)word->label_id || uVar10 - (long)word->label_id == 0)
      goto LAB_0013091e;
      goto LAB_00130745;
    }
    uVar12 = uVar9 + 3;
    if (-1 < (int)uVar9) {
      uVar12 = uVar9;
    }
    get_goal_string_abi_cxx11_((string *)local_68,this_00,byte_idx,((int)uVar12 >> 2) + -1);
    sVar15 = toForm((string *)&local_48);
    _Var11 = sVar15.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    *(pointer *)&this->stats = local_48._M_p;
    (this->stats).total_v2_pointers = (undefined4)sStack_40;
    (this->stats).total_v2_pointer_seeks = sStack_40._4_4_;
    if ((undefined1 *)local_68._0_8_ == local_68 + 0x10) goto LAB_0013090c;
    break;
  default:
    local_68._0_8_ = local_68 + 0x10;
    local_68._8_8_ = 0;
    local_68[0x10] = '\0';
    append_word_to_string(this_00,(string *)local_68,word);
    printf("don\'t know how to print %s\n",local_68._0_8_);
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFile.cpp"
                  ,800,
                  "std::shared_ptr<Form> LinkedObjectFile::to_form_script_object(int, int, std::vector<bool> &)"
                 );
  case 4:
LAB_00130745:
    sVar15 = toForm((string *)local_68);
    _Var11 = sVar15.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
LAB_001307ed:
    (this->stats).total_code_bytes = local_68._0_4_;
    (this->stats).total_v2_code_bytes = local_68._4_4_;
    (this->stats).total_v2_pointers = local_68._8_4_;
    (this->stats).total_v2_pointer_seeks = local_68._12_4_;
    goto LAB_0013090c;
  case 5:
    if (gSymbolTable.empty_pair.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      _Var11._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
      if (__libc_single_threaded == '\0') {
        LOCK();
        (gSymbolTable.empty_pair.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (gSymbolTable.empty_pair.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
        p_Var14 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&(this->stats).total_v2_pointers
        ;
        *(element_type **)&this->stats = peVar4;
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&(this->stats).total_v2_pointers =
             _Var5._M_pi;
        if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14);
          _Var11._M_pi = extraout_RDX;
        }
        goto LAB_0013090c;
      }
      (gSymbolTable.empty_pair.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (gSymbolTable.empty_pair.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
    }
    *(element_type **)&this->stats = peVar4;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&(this->stats).total_v2_pointers = _Var5._M_pi
    ;
    goto LAB_0013090c;
  }
  sStack_40 = 0;
  local_48._M_p = (pointer)0x0;
  operator_delete((void *)local_68._0_8_,CONCAT71(local_68._17_7_,local_68[0x10]) + 1);
  _Var11._M_pi = extraout_RDX_00;
LAB_0013090c:
  sVar15.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var11._M_pi;
  sVar15.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Form>)sVar15.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Form> LinkedObjectFile::to_form_script_object(int seg,
                                                              int byte_idx,
                                                              std::vector<bool>& seen) {
  std::shared_ptr<Form> result;

  switch (byte_idx & 7) {
    case 0:
    case 4: {
      auto& word = words_by_seg.at(seg).at(byte_idx / 4);
      if (word.kind == LinkedWord::SYM_PTR) {
        // .symbol xxxx
        result = toForm(word.symbol_name);
      } else if (word.kind == LinkedWord::PLAIN_DATA) {
        // .word xxxxx
        result = toForm(std::to_string(word.data));
      } else if (word.kind == LinkedWord::PTR) {
        // might be a sub-list, or some other random pointer
        auto offset = labels.at(word.label_id).offset;
        if ((offset & 7) == 2) {
          // list!
          result = to_form_script(seg, offset / 4, seen);
        } else {
          if (is_string(seg, offset)) {
            result = toForm(get_goal_string(seg, offset / 4 - 1));
          } else {
            // some random pointer, just print the label.
            result = toForm(labels.at(word.label_id).name);
          }
        }
      } else if (word.kind == LinkedWord::EMPTY_PTR) {
        result = gSymbolTable.getEmptyPair();
      } else {
        std::string debug;
        append_word_to_string(debug, word);
        printf("don't know how to print %s\n", debug.c_str());
        assert(false);
      }
    } break;

    case 2:  // bad, a pair snuck through.
    default:
      // pointers should be aligned!
      printf("align %d\n", byte_idx & 7);
      assert(false);
  }

  return result;
}